

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinFT98_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  long in_RCX;
  int in_EDI;
  double in_R8;
  double in_R9;
  double in_XMM0_Qa;
  double vt;
  double vl;
  double vs;
  double vr;
  double e;
  double lapl_i;
  int32_t i;
  double *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  double *in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  double *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    mgga_screening_interface<ExchCXX::BuiltinFT98_X>::eval_exc_vxc_unpolar
              (in_R8,in_R9,(double)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
               *(double *)(in_RCX + (long)iVar1 * 8),in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90);
    *(double *)((long)in_R9 + (long)iVar1 * 8) =
         in_XMM0_Qa * (double)in_stack_ffffffffffffffb0 + *(double *)((long)in_R9 + (long)iVar1 * 8)
    ;
    *(double *)((long)vt + (long)iVar1 * 8) =
         in_XMM0_Qa * (double)in_stack_ffffffffffffffa8 + *(double *)((long)vt + (long)iVar1 * 8);
    *(double *)((long)vl + (long)iVar1 * 8) =
         in_XMM0_Qa * (double)in_stack_ffffffffffffffa0 + *(double *)((long)vl + (long)iVar1 * 8);
    *(double *)((long)vr + (long)iVar1 * 8) =
         in_XMM0_Qa * (double)in_stack_ffffffffffffff90 + *(double *)((long)vr + (long)iVar1 * 8);
    *(double *)((long)vs + (long)iVar1 * 8) =
         in_XMM0_Qa * (double)in_stack_ffffffffffffff98 + *(double *)((long)vs + (long)iVar1 * 8);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double e, vr, vs, vl, vt;
    
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i], 
      e, vr, vs, vl, vt );
    eps[i]    += scal_fact * e;
    vrho[i]   += scal_fact * vr;
    vsigma[i] += scal_fact * vs;
    vtau[i]   += scal_fact * vt;
    if(traits::needs_laplacian) vlapl[i] += scal_fact * vl;

  }


}